

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O2

int lj_cf_package_require(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *k;
  int *piVar3;
  char *pcVar4;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_settop(L,1);
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,2,k);
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 == 0) {
    lua_getfield(L,-0x2711,"loaders");
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      luaL_error(L,"\'package.loaders\' must be a table");
    }
    lua_pushlstring(L,"",0);
    iVar1 = 1;
    while( true ) {
      lua_rawgeti(L,-2,iVar1);
      iVar2 = lua_type(L,-1);
      if (iVar2 == 0) {
        pcVar4 = lua_tolstring(L,-2,(size_t *)0x0);
        luaL_error(L,"module \'%s\' not found:%s",k,pcVar4);
      }
      lua_pushstring(L,k);
      lua_call(L,1,1);
      iVar2 = lua_type(L,-1);
      if (iVar2 == 6) break;
      iVar2 = lua_isstring(L,-1);
      if (iVar2 == 0) {
        L->top = L->top + -1;
      }
      else {
        lua_concat(L,2);
      }
      iVar1 = iVar1 + 1;
    }
    lua_pushlightuserdata(L,&sentinel_);
    lua_setfield(L,2,k);
    lua_pushstring(L,k);
    lua_call(L,1,1);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      lua_setfield(L,2,k);
    }
    lua_getfield(L,2,k);
    piVar3 = (int *)lua_touserdata(L,-1);
    if (piVar3 == &sentinel_) {
      lua_pushboolean(L,1);
      lua_pushvalue(L,-1);
      lua_setfield(L,2,k);
    }
  }
  else {
    piVar3 = (int *)lua_touserdata(L,-1);
    if (piVar3 == &sentinel_) {
      luaL_error(L,"loop or previous error loading module \'%s\'",k);
    }
  }
  return 1;
}

Assistant:

static int lj_cf_package_require(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  int i;
  lua_settop(L, 1);  /* _LOADED table will be at index 2 */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, 2, name);
  if (lua_toboolean(L, -1)) {  /* is it there? */
    if (lua_touserdata(L, -1) == sentinel)  /* check loops */
      luaL_error(L, "loop or previous error loading module " LUA_QS, name);
    return 1;  /* package is already loaded */
  }
  /* else must load it; iterate over available loaders */
  lua_getfield(L, LUA_ENVIRONINDEX, "loaders");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.loaders") " must be a table");
  lua_pushliteral(L, "");  /* error message accumulator */
  for (i = 1; ; i++) {
    lua_rawgeti(L, -2, i);  /* get a loader */
    if (lua_isnil(L, -1))
      luaL_error(L, "module " LUA_QS " not found:%s",
		 name, lua_tostring(L, -2));
    lua_pushstring(L, name);
    lua_call(L, 1, 1);  /* call it */
    if (lua_isfunction(L, -1))  /* did it find module? */
      break;  /* module loaded successfully */
    else if (lua_isstring(L, -1))  /* loader returned error message? */
      lua_concat(L, 2);  /* accumulate it */
    else
      lua_pop(L, 1);
  }
  lua_pushlightuserdata(L, sentinel);
  lua_setfield(L, 2, name);  /* _LOADED[name] = sentinel */
  lua_pushstring(L, name);  /* pass name as argument to module */
  lua_call(L, 1, 1);  /* run loaded module */
  if (!lua_isnil(L, -1))  /* non-nil return? */
    lua_setfield(L, 2, name);  /* _LOADED[name] = returned value */
  lua_getfield(L, 2, name);
  if (lua_touserdata(L, -1) == sentinel) {   /* module did not set a value? */
    lua_pushboolean(L, 1);  /* use true as result */
    lua_pushvalue(L, -1);  /* extra copy to be returned */
    lua_setfield(L, 2, name);  /* _LOADED[name] = true */
  }
  lj_lib_checkfpu(L);
  return 1;
}